

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fFboTestUtil.cpp
# Opt level: O0

void __thiscall
deqp::gles3::Functional::FboTestUtil::Texture2DArrayShader::shadeFragments
          (Texture2DArrayShader *this,FragmentPacket *packets,int numPackets,
          FragmentShadingContext *context)

{
  int iVar1;
  const_reference pvVar2;
  float x_;
  float y_;
  Vector<float,_4> *local_168;
  float *local_148;
  undefined1 local_13c [8];
  UVec4 uicolor;
  IVec4 icolor;
  undefined1 local_10c [8];
  Vec4 color;
  int fragNdx_1;
  float local_f0;
  undefined1 local_ec [8];
  Vec4 coord;
  int fragNdx;
  Texture2DArray *tex;
  undefined1 local_c8 [4];
  int packetNdx;
  Vec4 colors [4];
  Vec3 texCoords [4];
  undefined1 local_48 [4];
  int layer;
  Vec4 texBias;
  Vec4 texScale;
  FragmentShadingContext *context_local;
  int numPackets_local;
  FragmentPacket *packets_local;
  Texture2DArrayShader *this_local;
  
  pvVar2 = std::vector<sglr::UniformSlot,_std::allocator<sglr::UniformSlot>_>::operator[]
                     (&(this->super_ShaderProgram).m_uniforms,1);
  tcu::Vector<float,_4>::Vector
            ((Vector<float,_4> *)(texBias.m_data + 2),(float (*) [4])&pvVar2->value);
  pvVar2 = std::vector<sglr::UniformSlot,_std::allocator<sglr::UniformSlot>_>::operator[]
                     (&(this->super_ShaderProgram).m_uniforms,2);
  tcu::Vector<float,_4>::Vector((Vector<float,_4> *)local_48,(float (*) [4])&pvVar2->value);
  pvVar2 = std::vector<sglr::UniformSlot,_std::allocator<sglr::UniformSlot>_>::operator[]
                     (&(this->super_ShaderProgram).m_uniforms,3);
  iVar1 = (pvVar2->value).i;
  local_148 = colors[3].m_data + 2;
  do {
    tcu::Vector<float,_3>::Vector((Vector<float,_3> *)local_148);
    local_148 = local_148 + 3;
  } while (local_148 != texCoords[3].m_data + 1);
  local_168 = (Vector<float,_4> *)local_c8;
  do {
    tcu::Vector<float,_4>::Vector(local_168);
    local_168 = local_168 + 1;
  } while (local_168 != (Vector<float,_4> *)(colors[3].m_data + 2));
  for (tex._4_4_ = 0; tex._4_4_ < numPackets; tex._4_4_ = tex._4_4_ + 1) {
    pvVar2 = std::vector<sglr::UniformSlot,_std::allocator<sglr::UniformSlot>_>::operator[]
                       (&(this->super_ShaderProgram).m_uniforms,0);
    unique0x00012000 = (pvVar2->sampler).tex2DArray;
    for (coord.m_data[2] = 0.0; (int)coord.m_data[2] < 4;
        coord.m_data[2] = (float)((int)coord.m_data[2] + 1)) {
      rr::readTriangleVarying<float>
                ((rr *)local_ec,packets + tex._4_4_,context,0,(int)coord.m_data[2]);
      x_ = tcu::Vector<float,_4>::x((Vector<float,_4> *)local_ec);
      y_ = tcu::Vector<float,_4>::y((Vector<float,_4> *)local_ec);
      tcu::Vector<float,_3>::Vector((Vector<float,_3> *)(color.m_data + 3),x_,y_,(float)iVar1);
      *(undefined8 *)(texCoords[(long)(int)coord.m_data[2] + -1].m_data + 1) =
           stack0xffffffffffffff08;
      texCoords[(int)coord.m_data[2]].m_data[0] = local_f0;
    }
    sglr::rc::Texture2DArray::sample4
              (stack0xffffffffffffff28,(Vec4 *)local_c8,(Vec3 *)(colors[3].m_data + 2),0.0);
    for (color.m_data[2] = 0.0; (int)color.m_data[2] < 4;
        color.m_data[2] = (float)((int)color.m_data[2] + 1)) {
      tcu::operator*((tcu *)(icolor.m_data + 2),
                     (Vector<float,_4> *)(local_c8 + (long)(int)color.m_data[2] * 0x10),
                     (Vector<float,_4> *)(texBias.m_data + 2));
      tcu::operator+((tcu *)local_10c,(Vector<float,_4> *)(icolor.m_data + 2),
                     (Vector<float,_4> *)local_48);
      castVectorSaturate<int>((FboTestUtil *)(uicolor.m_data + 2),(Vec4 *)local_10c);
      castVectorSaturate<unsigned_int>((FboTestUtil *)local_13c,(Vec4 *)local_10c);
      if (this->m_outputType == TYPE_FLOAT_VEC4) {
        rr::writeFragmentOutput<tcu::Vector<float,4>>
                  (context,tex._4_4_,(int)color.m_data[2],0,(Vector<float,_4> *)local_10c);
      }
      else if (this->m_outputType == TYPE_INT_VEC4) {
        rr::writeFragmentOutput<tcu::Vector<int,4>>
                  (context,tex._4_4_,(int)color.m_data[2],0,(Vector<int,_4> *)(uicolor.m_data + 2));
      }
      else if (this->m_outputType == TYPE_UINT_VEC4) {
        rr::writeFragmentOutput<tcu::Vector<unsigned_int,4>>
                  (context,tex._4_4_,(int)color.m_data[2],0,(Vector<unsigned_int,_4> *)local_13c);
      }
    }
  }
  return;
}

Assistant:

void Texture2DArrayShader::shadeFragments (rr::FragmentPacket* packets, const int numPackets, const rr::FragmentShadingContext& context) const
{
	const tcu::Vec4 texScale	(m_uniforms[1].value.f4);
	const tcu::Vec4 texBias		(m_uniforms[2].value.f4);
	const int		layer		= m_uniforms[3].value.i;

	tcu::Vec3 texCoords[4];
	tcu::Vec4 colors[4];

	for (int packetNdx = 0; packetNdx < numPackets; ++packetNdx)
	{
		const sglr::rc::Texture2DArray* tex = m_uniforms[0].sampler.tex2DArray;

		for (int fragNdx = 0; fragNdx < 4; ++fragNdx)
		{
			const tcu::Vec4	coord = rr::readTriangleVarying<float>(packets[packetNdx], context, 0, fragNdx);
			texCoords[fragNdx] = tcu::Vec3(coord.x(), coord.y(), float(layer));
		}

		tex->sample4(colors, texCoords);

		for (int fragNdx = 0; fragNdx < 4; ++fragNdx)
		{
			const tcu::Vec4		color	= colors[fragNdx] * texScale + texBias;
			const tcu::IVec4	icolor	= castVectorSaturate<deInt32>(color);
			const tcu::UVec4	uicolor	= castVectorSaturate<deUint32>(color);

			if (m_outputType == glu::TYPE_FLOAT_VEC4)			rr::writeFragmentOutput(context, packetNdx, fragNdx, 0, color);
			else if (m_outputType == glu::TYPE_INT_VEC4)		rr::writeFragmentOutput(context, packetNdx, fragNdx, 0, icolor);
			else if (m_outputType == glu::TYPE_UINT_VEC4)		rr::writeFragmentOutput(context, packetNdx, fragNdx, 0, uicolor);
			else
				DE_ASSERT(DE_FALSE);
		}
	}
}